

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O0

void lws_buflist_destroy_all_segments(lws_buflist **head)

{
  lws_buflist *plVar1;
  lws_buflist *p1;
  lws_buflist *p;
  lws_buflist **head_local;
  
  p1 = *head;
  while (p1 != (lws_buflist *)0x0) {
    plVar1 = p1->next;
    p1->next = (lws_buflist *)0x0;
    lws_realloc(p1,0,"lws_free");
    p1 = plVar1;
  }
  *head = (lws_buflist *)0x0;
  return;
}

Assistant:

void
lws_buflist_destroy_all_segments(struct lws_buflist **head)
{
	struct lws_buflist *p = *head, *p1;

	while (p) {
		p1 = p->next;
		p->next = NULL;
		lws_free(p);
		p = p1;
	}

	*head = NULL;
}